

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_handle.cpp
# Opt level: O0

void __thiscall polyscope::WeakReferrable::WeakReferrable(WeakReferrable *this)

{
  undefined4 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<int> *in_RDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__p;
  
  (in_RDI->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__WeakReferrable_0098b778;
  __p = &(in_RDI->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 0;
  std::shared_ptr<int>::shared_ptr<int,void>(in_RDI,(int *)__p);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)internal::getNextUniqueID();
  in_RDI[1].super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  return;
}

Assistant:

WeakReferrable::WeakReferrable()
    : weakReferrableDummyRef(new WeakHandleDummyType()), weakReferableUniqueID(internal::getNextUniqueID()) {}